

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniform_scalar_fe_space.h
# Opt level: O0

void __thiscall
lf::uscalfe::UniformScalarFESpace<double>::UniformScalarFESpace
          (UniformScalarFESpace<double> *this,shared_ptr<const_lf::mesh::Mesh> *mesh_p,
          shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> *rfs_tria_p,
          shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> *rfs_quad_p,
          shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> *rfs_edge_p,
          shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> *rfs_point_p)

{
  shared_ptr<const_lf::mesh::Mesh> local_48;
  shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> *local_38;
  shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> *rfs_point_p_local;
  shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> *rfs_edge_p_local;
  shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> *rfs_quad_p_local;
  shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> *rfs_tria_p_local;
  shared_ptr<const_lf::mesh::Mesh> *mesh_p_local;
  UniformScalarFESpace<double> *this_local;
  
  (this->super_ScalarFESpace<double>)._vptr_ScalarFESpace = (_func_int **)0x0;
  local_38 = rfs_point_p;
  rfs_point_p_local = rfs_edge_p;
  rfs_edge_p_local = rfs_quad_p;
  rfs_quad_p_local = rfs_tria_p;
  rfs_tria_p_local = (shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> *)mesh_p;
  mesh_p_local = (shared_ptr<const_lf::mesh::Mesh> *)this;
  fe::ScalarFESpace<double>::ScalarFESpace(&this->super_ScalarFESpace<double>);
  (this->super_ScalarFESpace<double>)._vptr_ScalarFESpace = (_func_int **)&PTR_Mesh_00c8f5f0;
  std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>::shared_ptr
            (&this->rfs_tria_p_,rfs_tria_p);
  std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>::shared_ptr
            (&this->rfs_quad_p_,rfs_quad_p);
  std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>::shared_ptr
            (&this->rfs_edge_p_,rfs_edge_p);
  std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>::shared_ptr
            (&this->rfs_point_p_,rfs_point_p);
  this->num_rsf_node_ = 0;
  this->num_rsf_edge_ = 0;
  this->num_rsf_tria_ = 0;
  this->num_rsf_quad_ = 0;
  std::shared_ptr<const_lf::mesh::Mesh>::shared_ptr(&local_48,mesh_p);
  InitDofHandler(&this->dofh_,this,&local_48);
  std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr(&local_48);
  return;
}

Assistant:

UniformScalarFESpace(
      std::shared_ptr<const lf::mesh::Mesh> mesh_p,
      std::shared_ptr<const lf::fe::ScalarReferenceFiniteElement<SCALAR>>
          rfs_tria_p,
      std::shared_ptr<const lf::fe::ScalarReferenceFiniteElement<SCALAR>>
          rfs_quad_p,
      std::shared_ptr<const lf::fe::ScalarReferenceFiniteElement<SCALAR>>
          rfs_edge_p = nullptr,
      std::shared_ptr<const lf::fe::ScalarReferenceFiniteElement<SCALAR>>
          rfs_point_p = nullptr)
      : lf::fe::ScalarFESpace<SCALAR>(),
        rfs_tria_p_(std::move(rfs_tria_p)),
        rfs_quad_p_(std::move(rfs_quad_p)),
        rfs_edge_p_(std::move(rfs_edge_p)),
        rfs_point_p_(std::move(rfs_point_p)),
        dofh_(InitDofHandler(std::move(mesh_p))) {}